

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldTypes.h
# Opt level: O2

void __thiscall
FIX::DateTime::getHMS(DateTime *this,int *hour,int *minute,int *second,int *fraction,int precision)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar3 = this->m_time / 1000000000;
  uVar4 = (int)uVar3 >> 0x1f;
  *hour = (int)((long)((ulong)uVar4 << 0x20 | uVar3 & 0xffffffff) / 0xe10);
  uVar3 = (ulong)uVar4 << 0x20 | uVar3 & 0xffffffff;
  uVar1 = (long)uVar3 / 0x3c;
  *minute = (int)((long)((ulong)(uint)((int)uVar1 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 0x3c);
  *second = (int)((long)uVar3 % 0x3c);
  iVar2 = getFraction(this,precision);
  *fraction = iVar2;
  return;
}

Assistant:

inline void getHMS( int& hour, int& minute, int& second, int& fraction, int precision ) const
  {
    int ticks = (int)(m_time / NANOS_PER_SEC);
    hour = ticks / SECONDS_PER_HOUR;
    minute = (ticks / SECONDS_PER_MIN) % MINUTES_PER_HOUR;
    second = ticks % SECONDS_PER_MIN;
    fraction = getFraction(precision);
  }